

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.h
# Opt level: O0

CostType __thiscall wasm::CostAnalyzer::visitStructCmpxchg(CostAnalyzer *this,StructCmpxchg *curr)

{
  CostType CVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  StructCmpxchg *curr_local;
  CostAnalyzer *this_local;
  
  CVar1 = nullCheckCost(this,curr->ref);
  uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->ref);
  uVar3 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->expected);
  uVar4 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->replacement);
  return CVar1 + 10 + uVar2 + uVar3 + uVar4;
}

Assistant:

CostType visitStructCmpxchg(StructCmpxchg* curr) {
    return AtomicCost + nullCheckCost(curr->ref) + visit(curr->ref) +
           visit(curr->expected) + visit(curr->replacement);
  }